

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

ai_real __thiscall Assimp::XFileParser::ReadFloat(XFileParser *this)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  float local_34 [2];
  ai_real result;
  ai_real result_2;
  ai_real result_1;
  double res;
  XFileParser *pXStack_18;
  unsigned_short tmp;
  XFileParser *this_local;
  
  pXStack_18 = this;
  if ((this->mIsBinaryFormat & 1U) == 0) {
    FindNextNoneWhiteSpace(this);
    iVar3 = strncmp(this->mP,"-1.#IND00",9);
    if ((iVar3 == 0) || (iVar3 = strncmp(this->mP,"1.#IND00",8), iVar3 == 0)) {
      this->mP = this->mP + 9;
      CheckForSeparator(this);
      this_local._4_4_ = 0.0;
    }
    else {
      iVar3 = strncmp(this->mP,"1.#QNAN0",8);
      if (iVar3 == 0) {
        this->mP = this->mP + 8;
        CheckForSeparator(this);
        this_local._4_4_ = 0.0;
      }
      else {
        local_34[0] = 0.0;
        pcVar4 = fast_atoreal_move<float>(this->mP,local_34,true);
        this->mP = pcVar4;
        CheckForSeparator(this);
        this_local._4_4_ = local_34[0];
      }
    }
  }
  else {
    if ((this->mBinaryNumCount == 0) && (1 < (long)this->mEnd - (long)this->mP)) {
      res._6_2_ = ReadBinWord(this);
      if ((res._6_2_ == 7) && (3 < (long)this->mEnd - (long)this->mP)) {
        uVar2 = ReadBinDWord(this);
        this->mBinaryNumCount = uVar2;
      }
      else {
        this->mBinaryNumCount = 1;
      }
    }
    this->mBinaryNumCount = this->mBinaryNumCount - 1;
    if (this->mBinaryFloatSize == 8) {
      if ((long)this->mEnd - (long)this->mP < 8) {
        this->mP = this->mEnd;
        this_local._4_4_ = 0.0;
      }
      else {
        dVar1 = *(double *)this->mP;
        this->mP = this->mP + 8;
        this_local._4_4_ = (float)dVar1;
      }
    }
    else if ((long)this->mEnd - (long)this->mP < 4) {
      this->mP = this->mEnd;
      this_local._4_4_ = 0.0;
    }
    else {
      this_local._4_4_ = *(float *)this->mP;
      this->mP = this->mP + 4;
    }
  }
  return this_local._4_4_;
}

Assistant:

ai_real XFileParser::ReadFloat()
{
    if( mIsBinaryFormat)
    {
        if( mBinaryNumCount == 0 && mEnd - mP >= 2)
        {
            unsigned short tmp = ReadBinWord(); // 0x07 or 0x42
            if( tmp == 0x07 && mEnd - mP >= 4) // array of floats following
                mBinaryNumCount = ReadBinDWord();
            else // single float following
                mBinaryNumCount = 1;
        }

        --mBinaryNumCount;
        if( mBinaryFloatSize == 8) {
            if( mEnd - mP >= 8) {
                double res;
                ::memcpy( &res, mP, 8 );
                mP += 8;
                const ai_real result( static_cast<ai_real>( res ) );
                return result;
            } else {
                mP = mEnd;
                return 0;
            }
        } else {
            if( mEnd - mP >= 4) {
                ai_real result;
                ::memcpy( &result, mP, 4 );
                mP += 4;
                return result;
            } else {
                mP = mEnd;
                return 0;
            }
        }
    }

    // text version
    FindNextNoneWhiteSpace();
    // check for various special strings to allow reading files from faulty exporters
    // I mean you, Blender!
    // Reading is safe because of the terminating zero
    if( strncmp( mP, "-1.#IND00", 9) == 0 || strncmp( mP, "1.#IND00", 8) == 0)
    {
        mP += 9;
        CheckForSeparator();
        return 0.0;
    } else
    if( strncmp( mP, "1.#QNAN0", 8) == 0)
    {
        mP += 8;
        CheckForSeparator();
        return 0.0;
    }

    ai_real result = 0.0;
    mP = fast_atoreal_move<ai_real>( mP, result);

    CheckForSeparator();

    return result;
}